

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O1

void helper_sve_punpk_p_aarch64(void *vd,void *vn,uint32_t pred_desc)

{
  int i;
  uint uVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  ARMPredicateReg tmp_n;
  undefined1 local_48 [40];
  
  uVar1 = pred_desc & 0x1f;
  uVar8 = uVar1 + 2;
  uVar3 = pred_desc >> 0xc & 1;
  if (uVar1 < 7) {
    uVar8 = uVar8 * 4;
    iVar4 = uVar3 * uVar8;
    if (0x40U - iVar4 < uVar8) {
      __assert_fail("start >= 0 && length > 0 && length <= 64 - start",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/bitops.h"
                    ,0x158,"uint64_t extract64(uint64_t, int, int)");
    }
    uVar5 = (ulong)((uint)(0xffffffffffffffff >> (-(char)uVar8 & 0x3fU)) &
                   (uint)(*vn >> ((byte)iVar4 & 0x3f)));
    lVar2 = 4;
    do {
      uVar5 = (uVar5 | uVar5 << ((byte)(1 << ((byte)lVar2 & 0x1f)) & 0x3f)) &
              even_bit_esz_masks[lVar2];
      bVar9 = lVar2 != 0;
      lVar2 = lVar2 + -1;
    } while (bVar9);
    *(ulong *)vd = uVar5;
  }
  else {
    if ((ulong)((long)vn - (long)vd) < (ulong)uVar8) {
      memcpy(local_48,vn,(ulong)uVar8);
      vn = local_48;
    }
    uVar5 = 0;
    if (uVar3 != 0) {
      uVar5 = (ulong)(uVar8 >> 1);
    }
    if ((uVar5 & 3) == 0) {
      uVar6 = 0;
      do {
        uVar7 = (ulong)*(uint *)((long)vn + (uVar6 + (uVar5 >> 2)) * 4);
        lVar2 = 4;
        do {
          uVar7 = (uVar7 | uVar7 << ((byte)(1 << ((byte)lVar2 & 0x1f)) & 0x3f)) &
                  even_bit_esz_masks[lVar2];
          bVar9 = lVar2 != 0;
          lVar2 = lVar2 + -1;
        } while (bVar9);
        *(ulong *)((long)vd + uVar6 * 8) = uVar7;
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar1 + 9 >> 3);
    }
    else {
      uVar6 = 0;
      do {
        uVar7 = (ulong)*(byte *)((long)vn + uVar6 + uVar5);
        lVar2 = 4;
        do {
          uVar7 = (uVar7 | uVar7 << ((byte)(1 << ((byte)lVar2 & 0x1f)) & 0x3f)) &
                  even_bit_esz_masks[lVar2];
          bVar9 = lVar2 != 0;
          lVar2 = lVar2 + -1;
        } while (bVar9);
        *(short *)((long)vd + uVar6 * 2) = (short)uVar7;
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar8 >> 1);
    }
  }
  return;
}

Assistant:

void HELPER(sve_punpk_p)(void *vd, void *vn, uint32_t pred_desc)
{
    intptr_t oprsz = extract32(pred_desc, 0, SIMD_OPRSZ_BITS) + 2;
    intptr_t high = extract32(pred_desc, SIMD_DATA_SHIFT + 2, 1);
    uint64_t *d = vd;
    intptr_t i;

    if (oprsz <= 8) {
        uint64_t nn = *(uint64_t *)vn;
        int half = 4 * oprsz;

        nn = extract64(nn, high * half, half);
        nn = expand_bits(nn, 0);
        d[0] = nn;
    } else {
        ARMPredicateReg tmp_n;

        /* We produce output faster than we consume input.
           Therefore we must be mindful of possible overlap.  */
        if (((char *)vn - (char *)vd) < (uintptr_t)oprsz) {
            vn = memcpy(&tmp_n, vn, oprsz);
        }
        if (high) {
            high = oprsz >> 1;
        }

        if ((high & 3) == 0) {
            uint32_t *n = vn;
            high >>= 2;

            for (i = 0; i < DIV_ROUND_UP(oprsz, 8); i++) {
                uint64_t nn = n[H4(high + i)];
                d[i] = expand_bits(nn, 0);
            }
        } else {
            uint16_t *d16 = vd;
            uint8_t *n = vn;

            for (i = 0; i < oprsz / 2; i++) {
                uint16_t nn = n[H1(high + i)];
                d16[H2(i)] = expand_bits(nn, 0);
            }
        }
    }
}